

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

uint32_t __thiscall doublechecked::Roaring::maximum(Roaring *this)

{
  bool bVar1;
  uint32_t uVar2;
  reference puVar3;
  Roaring *in_RDI;
  uint32_t ans;
  undefined4 in_stack_ffffffffffffffdc;
  int line;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  uint32_t uVar4;
  
  uVar2 = roaring::Roaring::maximum(in_RDI);
  bVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::empty
                    ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                     0x10f7da);
  if (bVar1) {
    line = CONCAT13(uVar2 == 0,(int3)in_stack_ffffffffffffffdc);
  }
  else {
    uVar4 = uVar2;
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::rbegin
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffffdc,uVar2));
    puVar3 = std::reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_>::operator*
                       ((reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_> *)in_RDI);
    line = CONCAT13(uVar2 == *puVar3,(int3)in_stack_ffffffffffffffdc);
    uVar2 = uVar4;
  }
  _assert_true(CONCAT44(uVar2,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8,(char *)in_RDI,
               line);
  return uVar2;
}

Assistant:

uint32_t maximum() const {
        uint32_t ans = plain.maximum();
        assert_true(check.empty() ? ans == 0 : ans == *check.rbegin());
        return ans;
    }